

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O0

uint32_t rest_rpc::MD5::MD5CE::CalcG(uint32_t i)

{
  uint32_t i_local;
  undefined4 local_4;
  
  local_4 = i;
  if (0xf < i) {
    if (i < 0x20) {
      local_4 = i * 5 + 1 & 0xf;
    }
    else if (i < 0x30) {
      local_4 = i * 3 + 5 & 0xf;
    }
    else {
      local_4 = i * 7 & 0xf;
    }
  }
  return local_4;
}

Assistant:

static uint32_t CalcG(const uint32_t i) {
    //    DCHECK_LT(i, 64u);
    if (i < 16) {
      return i;
    } else if (i < 32) {
      return (5 * i + 1) % 16;
    } else if (i < 48) {
      return (3 * i + 5) % 16;
    } else {
      return (7 * i) % 16;
    }
  }